

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::UnitTestImpl::AddTestInfo
          (UnitTestImpl *this,SetUpTestCaseFunc set_up_tc,TearDownTestCaseFunc tear_down_tc,
          TestInfo *test_info)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 in_RDI;
  char *unaff_retaddr;
  GTestLogSeverity in_stack_0000000c;
  GTestLog *in_stack_00000010;
  char *in_stack_00000078;
  char *in_stack_00000080;
  UnitTestImpl *in_stack_00000088;
  TestInfo *in_stack_ffffffffffffff88;
  FilePath *in_stack_ffffffffffffff90;
  TestInfo *in_stack_ffffffffffffff98;
  TestCase *in_stack_ffffffffffffffa0;
  undefined4 line;
  
  line = (undefined4)((ulong)in_RDI >> 0x20);
  bVar1 = FilePath::IsEmpty(in_stack_ffffffffffffff90);
  if (bVar1) {
    FilePath::GetCurrentDir();
    FilePath::Set(in_stack_ffffffffffffff90,(FilePath *)in_stack_ffffffffffffff88);
    FilePath::~FilePath((FilePath *)0x1ff12c);
    bVar1 = FilePath::IsEmpty(in_stack_ffffffffffffff90);
    bVar1 = IsTrue((bool)((bVar1 ^ 0xffU) & 1));
    if (!bVar1) {
      in_stack_ffffffffffffff98 = (TestInfo *)&stack0xffffffffffffffc0;
      GTestLog::GTestLog(in_stack_00000010,in_stack_0000000c,unaff_retaddr,line);
      poVar2 = GTestLog::GetStream((GTestLog *)in_stack_ffffffffffffff98);
      in_stack_ffffffffffffffa0 =
           (TestCase *)std::operator<<(poVar2,"Condition !original_working_dir_.IsEmpty() failed. ")
      ;
      std::operator<<((ostream *)in_stack_ffffffffffffffa0,
                      "Failed to get the current working directory.");
      GTestLog::~GTestLog((GTestLog *)in_stack_ffffffffffffff90);
    }
  }
  TestInfo::test_case_name((TestInfo *)0x1ff1f4);
  TestInfo::type_param(in_stack_ffffffffffffff88);
  GetTestCase(in_stack_00000088,in_stack_00000080,in_stack_00000078,(SetUpTestCaseFunc)this,
              set_up_tc);
  TestCase::AddTestInfo(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return;
}

Assistant:

void AddTestInfo(Test::SetUpTestCaseFunc set_up_tc,
                   Test::TearDownTestCaseFunc tear_down_tc,
                   TestInfo* test_info) {
    // In order to support thread-safe death tests, we need to
    // remember the original working directory when the test program
    // was first invoked.  We cannot do this in RUN_ALL_TESTS(), as
    // the user may have changed the current directory before calling
    // RUN_ALL_TESTS().  Therefore we capture the current directory in
    // AddTestInfo(), which is called to register a TEST or TEST_F
    // before main() is reached.
    if (original_working_dir_.IsEmpty()) {
      original_working_dir_.Set(FilePath::GetCurrentDir());
      GTEST_CHECK_(!original_working_dir_.IsEmpty())
          << "Failed to get the current working directory.";
    }

    GetTestCase(test_info->test_case_name(),
                test_info->type_param(),
                set_up_tc,
                tear_down_tc)->AddTestInfo(test_info);
  }